

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O0

void __thiscall
ADSBBase::ProcessV2(ADSBBase *this,JSON_Object *pJAc,FDKeyTy *fdKey,double tBufPeriod,
                   double adsbxTime,positionTy *viewPos)

{
  bool bVar1;
  undefined1 bAllowNanAltIfGnd;
  int iVar2;
  uint uVar3;
  logLevelTy lVar4;
  char *pcVar5;
  double *pdVar6;
  string *psVar7;
  ulong uVar8;
  string *psVar9;
  long lVar10;
  undefined8 uVar11;
  int *in_RDX;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar12;
  double dLon;
  double dVar13;
  double dTS;
  double dHead;
  LTFlightData *this_00;
  positionTy *this_01;
  double in_XMM1_Qa;
  FDDynamicData dyn;
  FDStaticData stat;
  lock_guard<std::recursive_mutex> fdLock;
  LTFlightData *fd;
  unique_lock<std::mutex> mapFdLock;
  string cat;
  string acTy;
  string reg;
  double qnh;
  double baro_alt;
  JSON_Value *pAltBaro;
  double dist;
  positionTy pos;
  double ageOfPos;
  positionTy *in_stack_fffffffffffffb98;
  FDStaticData *in_stack_fffffffffffffba0;
  JSON_Object *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  FDKeyTy *in_stack_fffffffffffffbb8;
  LTFlightData *in_stack_fffffffffffffbc0;
  allocator<char> *in_stack_fffffffffffffbd0;
  key_type *in_stack_fffffffffffffbd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  FDKeyType in_stack_fffffffffffffc14;
  FDKeyTy *in_stack_fffffffffffffc18;
  DatRequTy masterDataType;
  double in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  JSON_Value_Type in_stack_fffffffffffffc7c;
  string local_348 [40];
  long local_320;
  undefined1 local_310;
  double local_308;
  double local_300;
  positionTy *local_2f8;
  double local_2f0;
  string local_2e0 [64];
  string local_2a0 [8];
  positionTy *in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  FDDynamicData *in_stack_fffffffffffffd78;
  LTFlightData *in_stack_fffffffffffffd80;
  string local_240 [44];
  byte local_214;
  string local_208 [88];
  string local_1b0 [112];
  mapped_type *local_140;
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [55];
  allocator<char> local_c1;
  string local_c0 [32];
  double local_a0;
  double local_98;
  JSON_Value *local_90;
  LTFlightData *local_88;
  positionTy local_80;
  double local_38;
  double local_28;
  double local_20;
  int *local_18;
  
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_38 = jog_n((JSON_Object *)in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
  if (local_38 < local_20) {
    pcVar5 = jog_s((JSON_Object *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (char *)in_stack_fffffffffffffba8);
    iVar2 = strcmp(pcVar5,"tisb_other");
    if (iVar2 != 0) {
      dVar12 = jog_n_nan(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
      dLon = jog_n_nan(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
      dVar13 = jog_n_nan(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
      dVar13 = dVar13 * 0.3048;
      dTS = local_28 - local_38;
      dHead = jog_n_nan(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
      positionTy::positionTy
                (&local_80,dVar12,dLon,dVar13,dTS,dHead,NAN,NAN,GND_UNKNOWN,UNIT_WORLD,UNIT_DEG,
                 FPH_UNKNOWN);
      pdVar6 = positionTy::heading(&local_80);
      uVar3 = std::isnan(*pdVar6);
      if ((uVar3 & 1) != 0) {
        dVar12 = jog_n_nan(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
        pdVar6 = positionTy::heading(&local_80);
        *pdVar6 = dVar12;
      }
      pdVar6 = positionTy::lat(&local_80);
      uVar3 = std::isnan(*pdVar6);
      if ((uVar3 & 1) == 0) {
        pdVar6 = positionTy::lon(&local_80);
        uVar3 = std::isnan(*pdVar6);
        if ((uVar3 & 1) == 0) {
          this_00 = (LTFlightData *)
                    positionTy::dist((positionTy *)in_stack_fffffffffffffba0,
                                     in_stack_fffffffffffffb98);
          local_88 = this_00;
          iVar2 = DataRefs::GetFdStdDistance_m(&dataRefs);
          if ((double)this_00 <= (double)iVar2) {
            local_90 = json_object_get_value
                                 (in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
            if (local_90 != (JSON_Value *)0x0) {
              in_stack_fffffffffffffc7c = json_value_get_type(local_90);
              if (in_stack_fffffffffffffc7c == 2) {
                pcVar5 = json_string((JSON_Value *)0x17fa69);
                iVar2 = strcmp(pcVar5,"ground");
                if (iVar2 == 0) {
                  local_80.f = (posFlagsTy)((ushort)local_80.f & 0xfcff | 0x200);
                  pdVar6 = positionTy::alt_m(&local_80);
                  *pdVar6 = NAN;
                }
              }
              else if (in_stack_fffffffffffffc7c == 3) {
                local_80.f = (posFlagsTy)((ushort)local_80.f & 0xfcff | 0x100);
                local_98 = json_number((JSON_Value *)0x17f9be);
                local_a0 = jog_n_nan(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
                uVar3 = std::isnan(local_a0);
                if ((uVar3 & 1) == 0) {
                  BaroAltToGeoAlt_ft((double)in_stack_fffffffffffffba0,
                                     (double)in_stack_fffffffffffffb98);
                  positionTy::SetAltFt
                            ((positionTy *)in_stack_fffffffffffffba0,
                             (double)in_stack_fffffffffffffb98);
                }
                else {
                  in_stack_fffffffffffffc70 = local_98;
                  DataRefs::GetPressureHPA(&dataRefs);
                  BaroAltToGeoAlt_ft((double)in_stack_fffffffffffffba0,
                                     (double)in_stack_fffffffffffffb98);
                  positionTy::SetAltFt
                            ((positionTy *)in_stack_fffffffffffffba0,
                             (double)in_stack_fffffffffffffb98);
                }
              }
            }
            bVar1 = positionTy::IsOnGnd(&local_80);
            if (!bVar1) {
              pdVar6 = positionTy::alt_m(&local_80);
              uVar3 = std::isnan(*pdVar6);
              if ((uVar3 & 1) != 0) {
                return;
              }
            }
            jog_s((JSON_Object *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                  (char *)in_stack_fffffffffffffba8);
            masterDataType = (DatRequTy)((ulong)&local_c1 >> 0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,
                       in_stack_fffffffffffffbd0);
            std::allocator<char>::~allocator(&local_c1);
            jog_s((JSON_Object *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                  (char *)in_stack_fffffffffffffba8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,
                       in_stack_fffffffffffffbd0);
            std::allocator<char>::~allocator(&local_f9);
            jog_s((JSON_Object *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                  (char *)in_stack_fffffffffffffba8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,
                       in_stack_fffffffffffffbd0);
            std::allocator<char>::~allocator(&local_121);
            bVar1 = std::operator==(&in_stack_fffffffffffffba0->reg,
                                    (char *)in_stack_fffffffffffffb98);
            if ((((bVar1) ||
                 (bVar1 = std::operator==(&in_stack_fffffffffffffba0->reg,
                                          (char *)in_stack_fffffffffffffb98), bVar1)) ||
                (bVar1 = std::operator==(&in_stack_fffffffffffffba0->reg,
                                         (char *)in_stack_fffffffffffffb98), bVar1)) ||
               (bVar1 = std::operator==(&in_stack_fffffffffffffba0->reg,
                                        (char *)in_stack_fffffffffffffb98), bVar1)) {
              psVar7 = DataRefs::GetDefaultCarIcaoType_abi_cxx11_(&dataRefs);
              std::__cxx11::string::operator=(local_f8,(string *)psVar7);
            }
            else {
              bVar1 = std::operator==(&in_stack_fffffffffffffba0->reg,
                                      (char *)in_stack_fffffffffffffb98);
              if ((((bVar1) ||
                   (bVar1 = std::operator==(&in_stack_fffffffffffffba0->reg,
                                            (char *)in_stack_fffffffffffffb98), bVar1)) ||
                  (bVar1 = std::operator==(&in_stack_fffffffffffffba0->reg,
                                           (char *)in_stack_fffffffffffffb98), bVar1)) ||
                 (((bVar1 = positionTy::IsOnGnd(&local_80), bVar1 &&
                   (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0)) &&
                  ((uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0 &&
                   (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0)))))) {
                psVar9 = (string *)std::__cxx11::string::operator=(local_f8,"TWR");
                std::__cxx11::string::operator=(local_c0,psVar9);
                std::__cxx11::string::operator=(local_120,"C3");
              }
            }
            std::unique_lock<std::mutex>::unique_lock
                      ((unique_lock<std::mutex> *)in_stack_fffffffffffffba0,
                       (mutex_type *)in_stack_fffffffffffffb98);
            LTFlightData::CheckDupKey(in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
            if (*local_18 == 6) {
              LTFlightData::CheckDupKey(in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
            }
            local_140 = std::
                        map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                        ::operator[]((map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                                      *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
            std::lock_guard<std::recursive_mutex>::lock_guard
                      ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffba0,
                       (mutex_type *)in_stack_fffffffffffffb98);
            std::unique_lock<std::mutex>::unlock
                      ((unique_lock<std::mutex> *)in_stack_fffffffffffffba0);
            bVar1 = LTFlightData::empty((LTFlightData *)0x17ff9f);
            if (bVar1) {
              LTFlightData::SetKey(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
            }
            LTFlightData::FDStaticData::FDStaticData(in_stack_fffffffffffffba0);
            std::__cxx11::string::operator=(local_2e0,local_c0);
            std::__cxx11::string::operator=(local_2a0,local_f8);
            lVar10 = jog_l((JSON_Object *)in_stack_fffffffffffffba0,
                           (char *)in_stack_fffffffffffffb98);
            local_214 = (byte)lVar10 & 1;
            pcVar5 = jog_s((JSON_Object *)
                           CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                           (char *)in_stack_fffffffffffffba8);
            std::__cxx11::string::operator=(local_208,pcVar5);
            trim(&in_stack_fffffffffffffba0->reg,(char *)in_stack_fffffffffffffb98);
            pcVar5 = GetADSBEmitterCat((string *)in_stack_fffffffffffffbb8);
            std::__cxx11::string::operator=(local_240,pcVar5);
            std::__cxx11::string::operator=(local_1b0,(string *)(in_RDI + 0x1e8));
            std::__cxx11::string::operator+=(local_1b0,(string *)(local_18 + 2));
            LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)in_stack_fffffffffffffba0);
            local_320 = jog_sl((JSON_Object *)in_stack_fffffffffffffba0,
                               (char *)in_stack_fffffffffffffb98);
            local_310 = positionTy::IsOnGnd(&local_80);
            pdVar6 = positionTy::heading(&local_80);
            local_308 = *pdVar6;
            local_300 = jog_n_nan(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
            this_01 = (positionTy *)
                      jog_n_nan(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
            local_2f8 = this_01;
            uVar3 = std::isnan((double)this_01);
            bAllowNanAltIfGnd = (undefined1)uVar3;
            if ((uVar3 & 1) != 0) {
              local_2f8 = (positionTy *)
                          jog_n_nan(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
            }
            pdVar6 = positionTy::ts(&local_80);
            local_2f0 = *pdVar6;
            LTFlightData::UpdateData
                      (this_00,(FDStaticData *)
                               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       in_stack_fffffffffffffc70,masterDataType);
            bVar1 = positionTy::isNormal(this_01,(bool)bAllowNanAltIfGnd);
            if (bVar1) {
              LTFlightData::AddDynData
                        (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                         in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,
                         in_stack_fffffffffffffd68);
            }
            else {
              lVar4 = DataRefs::GetLogLevel(&dataRefs);
              if ((int)lVar4 < 1) {
                pcVar5 = LTFlightData::FDKeyTy::c_str((FDKeyTy *)0x1802f3);
                positionTy::dbgTxt_abi_cxx11_
                          ((positionTy *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
                uVar11 = std::__cxx11::string::c_str();
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                       ,0x13a,"ProcessV2",logDEBUG,"A/c %s reached invalid pos: %s",pcVar5,uVar11);
                std::__cxx11::string::~string(local_348);
              }
            }
            LTFlightData::FDStaticData::~FDStaticData(in_stack_fffffffffffffba0);
            std::lock_guard<std::recursive_mutex>::~lock_guard
                      ((lock_guard<std::recursive_mutex> *)0x18039f);
            std::unique_lock<std::mutex>::~unique_lock
                      ((unique_lock<std::mutex> *)in_stack_fffffffffffffba0);
            std::__cxx11::string::~string(local_120);
            std::__cxx11::string::~string(local_f8);
            std::__cxx11::string::~string(local_c0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ADSBBase::ProcessV2 (const JSON_Object* pJAc,
                          LTFlightData::FDKeyTy& fdKey,
                          const double tBufPeriod,
                          const double adsbxTime,
                          const positionTy& viewPos)
{
    // skip stale data
    const double ageOfPos = jog_n(pJAc, ADSBEX_V2_SEE_POS);
    if (ageOfPos >= tBufPeriod)
        return;
    
    // skip TIS-B data...that is stuff that comes and goes with new ids every few requests, unusable
    if (!std::strcmp(jog_s(pJAc, ADSBEX_V2_TRANSP_TYPE),ADSBEX_V2_TYPE_TISB))
        return;
    
    // Try getting best possible position information
    // Some fields can come back NAN if not defined
    positionTy pos (jog_n_nan(pJAc, ADSBEX_V2_LAT),
                    jog_n_nan(pJAc, ADSBEX_V2_LON),
                    jog_n_nan(pJAc, ADSBEX_V2_ALT_GEOM) * M_per_FT,
                    adsbxTime - ageOfPos,
                    jog_n_nan(pJAc, ADSBEX_V2_HEADING));
    // If heading isn't available try track
    if (std::isnan(pos.heading()))
        pos.heading() = jog_n_nan(pJAc, ADSBEX_V2_TRACK);
    
    // If lat/lon isn't defined then the tracking data is stale: discard
    if (std::isnan(pos.lat()) || std::isnan(pos.lon()))
        return;
    
    // ADSBEx, especially the RAPID API version, returns
    // aircraft regardless of distance. To avoid planes
    // created and immediately removed due to distanced settings
    // we continue only if pos is within wanted range
    const double dist = pos.dist(viewPos);
    if (dist > dataRefs.GetFdStdDistance_m() )
        return;
    
    // The alt_baro field is string "ground" if on ground or can hold a baro altitude number
    const JSON_Value* pAltBaro = json_object_get_value(pJAc, ADSBEX_V2_ALT_BARO);
    if (pAltBaro) {
        switch (json_value_get_type(pAltBaro))
        {
            case JSONNumber:
            {
                pos.f.onGrnd = GND_OFF;         // we are definitely off ground
                // But we also process baro alt, potentially even overwriting a geo alt as baro alt is more accurate based on experience
                // try converting baro alt from given QNH, otherwise we use our own weather
                const double baro_alt = json_number(pAltBaro);
                const double qnh = jog_n_nan(pJAc, ADSBEX_V2_NAV_QNH);
                if (std::isnan(qnh))
                    pos.SetAltFt(BaroAltToGeoAlt_ft(baro_alt, dataRefs.GetPressureHPA()));
                else
                    pos.SetAltFt(BaroAltToGeoAlt_ft(baro_alt, qnh));
                break;
            }
                
            case JSONString:
                // There is just one string we are aware of: "ground"
                if (!strcmp(json_string(pAltBaro), "ground")) {
                    pos.f.onGrnd = GND_ON;
                    pos.alt_m() = NAN;
                }
                break;
        }
    }
    // _Some_ altitude info needs to be available now, otherwise skip data
    if (!pos.IsOnGnd() && std::isnan(pos.alt_m()))
        return;
    
    // Are we to skip static objects?
    std::string reg = jog_s(pJAc, ADSBEX_V2_REG);
    std::string acTy = jog_s(pJAc, ADSBEX_V2_AC_TYPE_ICAO);
    std::string cat = jog_s(pJAc, ADSBEX_V2_AC_CATEGORY);
    
    // Identify ground vehicles
    if (cat  == "C1"  || cat == "C2" ||
        reg  == "GND" ||
        acTy == "GND")
        acTy = dataRefs.GetDefaultCarIcaoType();
    // Mark all static objects equally, so they can optionally be hidden
    else if (reg  == STATIC_OBJECT_TYPE ||
             acTy == STATIC_OBJECT_TYPE ||
             cat  == "C3" ||
             // Everything else on the ground, which has no type, registration, category is considered static
             (pos.IsOnGnd() && acTy.empty() && reg.empty() && cat.empty()))

    {
        reg = acTy = STATIC_OBJECT_TYPE;
        cat = "C3";
    }

    // from here on access to fdMap guarded by a mutex
    // until FD object is inserted and updated
    std::unique_lock<std::mutex> mapFdLock (mapFdMutex);
    
    // Check for duplicates with OGN/FLARM, potentially replaces the key type
    LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_FLARM);
    // Some internal codes sometimes overlap with RealTraffic
    if (fdKey.eKeyType == LTFlightData::KEY_ADSBEX)
        LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_RT);

    // get the fd object from the map, key is the transpIcao
    // this fetches an existing or, if not existing, creates a new one
    LTFlightData& fd = mapFd[fdKey];
    
    // also get the data access lock once and for all
    // so following fetch/update calls only make quick recursive calls
    std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
    // now that we have the detail lock we can release the global one
    mapFdLock.unlock();
    
    // completely new? fill key fields
    if ( fd.empty() )
        fd.SetKey(fdKey);
    
    // -- fill static data --
    LTFlightData::FDStaticData stat;
    stat.reg =        reg;
    stat.acTypeIcao = acTy;
    stat.mil =        (jog_l(pJAc, ADSBEX_V2_FLAGS) & 0x01) == 0x01;
    stat.call =       jog_s(pJAc, ADSBEX_V2_FLIGHT);
    trim(stat.call);
    stat.catDescr = GetADSBEmitterCat(cat);
    stat.slug       = sSlugBase;
    stat.slug      += fdKey.key;
    
    // -- dynamic data --
    LTFlightData::FDDynamicData dyn;
    
    // non-positional dynamic data
    dyn.radar.code =        jog_sl(pJAc, ADSBEX_V2_RADAR_CODE);
    dyn.gnd =               pos.IsOnGnd();
    dyn.heading =           pos.heading();
    dyn.spd =               jog_n_nan(pJAc, ADSBEX_V2_SPD);
    dyn.vsi =               jog_n_nan(pJAc, ADSBEX_V2_VSI_GEOM);
    if (std::isnan(dyn.vsi))
        dyn.vsi =           jog_n_nan(pJAc, ADSBEX_V2_VSI_BARO);
    dyn.ts =                pos.ts();
    dyn.pChannel =          this;
    
    // update the a/c's master data
    fd.UpdateData(std::move(stat), dist);
    
    // position is rather important, we check for validity
    if ( pos.isNormal(true) ) {
        fd.AddDynData(dyn, 0, 0, &pos);
    }
    else
        LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
}